

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model_rd.h
# Opt level: O0

void model_rd_from_sse(AV1_COMP *cpi,MACROBLOCK *x,BLOCK_SIZE plane_bsize,int plane,int64_t sse,
                      int num_samples,int *rate,int64_t *dist)

{
  int iVar1;
  MACROBLOCKD *xd_00;
  int64_t *dist_00;
  int in_ECX;
  long in_RSI;
  long in_RDI;
  long in_R8;
  uint in_R9D;
  undefined4 *in_stack_00000008;
  int quantizer;
  int64_t square_error;
  int dequant_shift;
  macroblock_plane *p;
  MACROBLOCKD *xd;
  undefined4 local_58;
  byte local_50;
  uint in_stack_ffffffffffffffd8;
  
  xd_00 = (MACROBLOCKD *)(in_RSI + 0x1a0);
  dist_00 = (int64_t *)(in_RSI + (long)in_ECX * 0x88);
  iVar1 = is_cur_buf_hbd(xd_00);
  if (iVar1 == 0) {
    local_50 = 3;
  }
  else {
    local_50 = (char)xd_00->bd - 5;
  }
  if (*(int *)(in_RDI + 0x60c18) == 0) {
    av1_model_rd_from_var_lapndz(in_R8,in_R9D,in_stack_ffffffffffffffd8,&xd_00->mi_row,dist_00);
  }
  else {
    iVar1 = (int)*(short *)(dist_00[0x10] + 2) >> (local_50 & 0x1f);
    if (iVar1 < 0x78) {
      if (in_R8 * (0x118 - iVar1) >> 7 < 0x7fffffff) {
        local_58 = (undefined4)(in_R8 * (0x118 - iVar1) >> 7);
      }
      else {
        local_58 = 0x7fffffff;
      }
      *in_stack_00000008 = local_58;
    }
    else {
      *in_stack_00000008 = 0;
    }
    *(long *)square_error = in_R8 * iVar1 >> 8;
  }
  *(long *)square_error = *(long *)square_error << 4;
  return;
}

Assistant:

static inline void model_rd_from_sse(const AV1_COMP *const cpi,
                                     const MACROBLOCK *const x,
                                     BLOCK_SIZE plane_bsize, int plane,
                                     int64_t sse, int num_samples, int *rate,
                                     int64_t *dist) {
  (void)num_samples;
  const MACROBLOCKD *const xd = &x->e_mbd;
  const struct macroblock_plane *const p = &x->plane[plane];
  const int dequant_shift = (is_cur_buf_hbd(xd)) ? xd->bd - 5 : 3;

  // Fast approximate the modelling function.
  if (cpi->sf.rd_sf.simple_model_rd_from_var) {
    const int64_t square_error = sse;
    int quantizer = p->dequant_QTX[1] >> dequant_shift;
    if (quantizer < 120)
      *rate = (int)AOMMIN(
          (square_error * (280 - quantizer)) >> (16 - AV1_PROB_COST_SHIFT),
          INT_MAX);
    else
      *rate = 0;
    assert(*rate >= 0);
    *dist = (square_error * quantizer) >> 8;
  } else {
    av1_model_rd_from_var_lapndz(sse, num_pels_log2_lookup[plane_bsize],
                                 p->dequant_QTX[1] >> dequant_shift, rate,
                                 dist);
  }
  *dist <<= 4;
}